

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::setTiles(Fifteen *this)

{
  BoardMode BVar1;
  
  BVar1 = Controller::getBoardMode
                    ((this->controller)._M_t.
                     super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                     super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                     super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  if (BVar1 != NUMERIC) {
    setTilesGraphic(this);
    return;
  }
  setTilesNumeric(this);
  return;
}

Assistant:

void Fifteen::setTiles()
{
    BoardMode mode = controller->getBoardMode();
    if ( mode == BoardMode::NUMERIC )
    {
        setTilesNumeric();
    }
    else
    {
        setTilesGraphic();
    }
}